

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<double>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<double> *accessor)

{
  RESULT_TYPE_conflict4 input;
  double dVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<double>::operator()(accessor,&local_8);
  dVar1 = Cast::Operation<double,double>(input);
  return dVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}